

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

TArray<FName,_FName> * __thiscall
TArray<FName,_FName>::operator=(TArray<FName,_FName> *this,TArray<FName,_FName> *other)

{
  TArray<FName,_FName> *other_local;
  TArray<FName,_FName> *this_local;
  
  if (other != this) {
    if (this->Array != (FName *)0x0) {
      if (this->Count != 0) {
        DoDelete(this,0,this->Count - 1);
      }
      M_Free(this->Array);
    }
    DoCopy(this,other);
  }
  return this;
}

Assistant:

TArray<T,TT> &operator= (const TArray<T,TT> &other)
	{
		if (&other != this)
		{
			if (Array != NULL)
			{
				if (Count > 0)
				{
					DoDelete (0, Count-1);
				}
				M_Free (Array);
			}
			DoCopy (other);
		}
		return *this;
	}